

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

EVstone INT_EVcreate_immediate_action(CManager_conflict cm,char *action_spec,EVstone *target_list)

{
  EVstone stone;
  long lVar1;
  
  stone = INT_EValloc_stone(cm);
  EVassoc_immediate_action(cm,stone,action_spec,(void *)0x0);
  if (target_list != (EVstone *)0x0) {
    lVar1 = 0;
    do {
      if (target_list[lVar1] == 0) {
        return stone;
      }
      INT_EVstone_set_output(cm,stone,(int)lVar1,target_list[lVar1]);
      lVar1 = lVar1 + 1;
    } while (target_list != (EVstone *)0x0);
  }
  return stone;
}

Assistant:

EVstone
INT_EVcreate_immediate_action(CManager cm, char *action_spec, 
			      EVstone *target_list)
{
    int i = 0;
    EVstone stone = INT_EValloc_stone(cm);
    EVaction action = EVassoc_immediate_action(cm, stone, action_spec, NULL);
    while (target_list && (target_list[i] != 0)) {
	INT_EVaction_set_output(cm, stone, action, i, target_list[i]);
	i++;
    }
    return stone;
}